

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

sexp_conflict sexp_lookup_source_info(sexp_conflict src,int ip)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int i;
  int ip_local;
  sexp_conflict src_local;
  sexp_conflict local_8;
  
  src_local = src;
  if (((src != (sexp_conflict)0x0) && (((ulong)src & 3) == 0)) && (src->tag == 0x14)) {
    src_local = (((src->value).type.name)->value).type.slots;
  }
  if (((src_local == (sexp_conflict)0x0) || (((ulong)src_local & 3) != 0)) ||
     ((src_local->tag != 10 || ((src_local->value).type.name == (sexp)0x0)))) {
    local_8 = (sexp_conflict)&DAT_0000003e;
  }
  else {
    for (i = 1; i < (int)(src_local->value).vector.length; i = i + 1) {
      uVar1 = *(ulong *)(*(long *)((long)&src_local->value + (((long)i << 1) / 2) * 8 + 8) + 8);
      auVar2._8_8_ = (long)uVar1 >> 0x3f;
      auVar2._0_8_ = uVar1 & 0xfffffffffffffffe;
      if ((long)ip < SUB168(auVar2 / SEXT816(2),0)) {
        return *(sexp_conflict *)
                (*(long *)((long)&src_local->value + (((long)(i + -1) << 1) / 2) * 8 + 8) + 0x10);
      }
    }
    local_8 = *(sexp_conflict *)
               (*(long *)((long)&src_local->value +
                         ((long)(((src_local->value).stack.length - 1) * 2) / 2) * 8 + 8) + 0x10);
  }
  return local_8;
}

Assistant:

static sexp sexp_lookup_source_info (sexp src, int ip) {
  int i;
  if (src && sexp_procedurep(src))
    src = sexp_procedure_source(src);
  if (src && sexp_vectorp(src) && sexp_vector_length(src) > 0) {
    for (i=1; i<(int)sexp_vector_length(src); i++)
      if (sexp_unbox_fixnum(sexp_car(sexp_vector_ref(src, sexp_make_fixnum(i)))) > ip)
        return sexp_cdr(sexp_vector_ref(src, sexp_make_fixnum(i-1)));
    return sexp_cdr(sexp_vector_ref(src, sexp_make_fixnum(sexp_vector_length(src)-1)));
  }
  return SEXP_FALSE;
}